

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderCommonFunctionTests.cpp
# Opt level: O0

void __thiscall
vkt::shaderexecutor::anon_unknown_0::RoundEvenCase::RoundEvenCase
          (RoundEvenCase *this,TestContext *testCtx,DataType baseType,Precision precision,
          ShaderType shaderType)

{
  char *name;
  VarType local_148;
  allocator<char> local_129;
  string local_128;
  Symbol local_108;
  VarType local_d0;
  allocator<char> local_b1;
  string local_b0;
  Symbol local_90;
  string local_48;
  ShaderType local_24;
  Precision local_20;
  ShaderType shaderType_local;
  Precision precision_local;
  DataType baseType_local;
  TestContext *testCtx_local;
  RoundEvenCase *this_local;
  
  local_24 = shaderType;
  local_20 = precision;
  shaderType_local = baseType;
  _precision_local = testCtx;
  testCtx_local = (TestContext *)this;
  shaderexecutor::(anonymous_namespace)::getCommonFuncCaseName_abi_cxx11_
            (&local_48,(_anonymous_namespace_ *)(ulong)baseType,precision,shaderType,shaderType);
  name = (char *)std::__cxx11::string::c_str();
  CommonFunctionCase::CommonFunctionCase
            (&this->super_CommonFunctionCase,testCtx,name,"roundEven",local_24);
  std::__cxx11::string::~string((string *)&local_48);
  (this->super_CommonFunctionCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__RoundEvenCase_016b5e88;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"in0",&local_b1);
  glu::VarType::VarType(&local_d0,shaderType_local,local_20);
  Symbol::Symbol(&local_90,&local_b0,&local_d0);
  std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::push_back
            (&(this->super_CommonFunctionCase).m_spec.inputs,&local_90);
  Symbol::~Symbol(&local_90);
  glu::VarType::~VarType(&local_d0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"out0",&local_129);
  glu::VarType::VarType(&local_148,shaderType_local,local_20);
  Symbol::Symbol(&local_108,&local_128,&local_148);
  std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::push_back
            (&(this->super_CommonFunctionCase).m_spec.outputs,&local_108);
  Symbol::~Symbol(&local_108);
  glu::VarType::~VarType(&local_148);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator(&local_129);
  std::__cxx11::string::operator=
            ((string *)&(this->super_CommonFunctionCase).m_spec.source,"out0 = roundEven(in0);");
  return;
}

Assistant:

RoundEvenCase (tcu::TestContext& testCtx, glu::DataType baseType, glu::Precision precision, glu::ShaderType shaderType)
		: CommonFunctionCase	(testCtx, getCommonFuncCaseName(baseType, precision, shaderType).c_str(), "roundEven", shaderType)
	{
		m_spec.inputs.push_back(Symbol("in0", glu::VarType(baseType, precision)));
		m_spec.outputs.push_back(Symbol("out0", glu::VarType(baseType, precision)));
		m_spec.source = "out0 = roundEven(in0);";
	}